

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diag.cpp
# Opt level: O0

char * Mond::GetSeverityName(Severity s)

{
  invalid_argument *this;
  char *pcStack_10;
  Severity s_local;
  
  if (s == Info) {
    pcStack_10 = "info";
  }
  else if (s == Warning) {
    pcStack_10 = "warning";
  }
  else {
    if (s != Error) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"unknown diagnostic severity");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pcStack_10 = "error";
  }
  return pcStack_10;
}

Assistant:

const char *Mond::GetSeverityName(Severity s)
{
	switch (s)
	{
	case Info:
		return "info";
	case Warning:
		return "warning";
	case Error:
		return "error";
	}

	throw invalid_argument("unknown diagnostic severity");
}